

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O1

void directed_flag_complex_in_memory_computer::
     prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *complex,
               filtered_directed_graph_t *graph,filtration_algorithm_t *filtration_algorithm,
               size_t nb_threads)

{
  pointer pfVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  void *pvVar4;
  int iVar5;
  ostream *poVar6;
  byte bVar7;
  size_t sVar8;
  bool bVar9;
  size_type sVar10;
  long lVar11;
  long lVar12;
  unsigned_short *puVar13;
  float *pfVar14;
  pointer puVar15;
  ulong uVar16;
  long lVar17;
  float extraout_XMM0_Da;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  reorder_filtration;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  vector<float,_std::allocator<float>_> local_d0;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  local_b8;
  size_t local_98;
  compute_filtration_t local_90;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_50;
  reorder_edges_t local_48;
  
  local_98 = nb_threads;
  if (filtration_algorithm == (filtration_algorithm_t *)0x0) {
    local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_2_ = 0;
    local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._2_2_ = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_90,
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_d0
               ,(allocator_type *)&local_b8);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&graph->vertex_filtration,(vector<float,_std::allocator<float>_> *)&local_90);
    if ((pointer)local_90._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._0_8_,(long)local_90.graph - local_90._0_8_);
    }
  }
  else {
    iVar5 = (*filtration_algorithm->_vptr_filtration_algorithm_t[3])(filtration_algorithm);
    if ((char)iVar5 != '\0') {
      local_90._0_8_ = &PTR_vertex_0014f288;
      local_90.filtration_algorithm = (filtration_algorithm_t *)0x0;
      local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_2_ = 0;
      if ((graph->super_directed_graph_t).number_of_vertices != 0) {
        do {
          local_90.filtration_algorithm = (filtration_algorithm_t *)&local_d0;
          (*filtration_algorithm->_vptr_filtration_algorithm_t[2])
                    (filtration_algorithm,0,&local_90,graph);
          (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start
          [(ushort)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start] = extraout_XMM0_Da;
          local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start._0_2_ =
               (ushort)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
        } while ((ushort)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start <
                 (graph->super_directed_graph_t).number_of_vertices);
      }
    }
  }
  bVar7 = 1;
  if ((filtration_algorithm != (filtration_algorithm_t *)0x0) &&
     (((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start ||
      (iVar5 = (*filtration_algorithm->_vptr_filtration_algorithm_t[4])(filtration_algorithm),
      (char)iVar5 != '\0')))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing the filtration of all edges",0x25);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\r",1);
    local_90.current_index = 0xffffffff;
    local_90.boundary_filtration = (value_t *)0x0;
    local_90.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.filtration_algorithm = filtration_algorithm;
    local_90.graph = graph;
    local_90.complex = complex;
    directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
              (complex,&local_90,1,-1);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    std::vector<float,_std::allocator<float>_>::vector(&local_d0,&local_90.next_filtration);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(&graph->edge_filtration,&local_d0);
    pvVar4 = (void *)CONCAT44(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              CONCAT22(local_d0.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._2_2_,
                                       (ushort)local_d0.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start));
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_d0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4)
      ;
    }
    if (local_90.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.next_filtration.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.next_filtration.
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    bVar7 = 0;
  }
  bVar9 = (bool)(filtration_algorithm != (filtration_algorithm_t *)0x0 & bVar7);
  if ((bVar9 == true) &&
     (puVar15 = (graph->super_directed_graph_t).edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start,
     2 < (ulong)((long)(graph->super_directed_graph_t).edges.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar15))) {
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
                ((directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)
                 ((long)&((complex->vertex_cells).
                          super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->vertex +
                 (ulong)((uint)*puVar15 * 0x18)),1,puVar15,
                 (pair<int,_float>)((ulong)(uint)pfVar1[uVar16] << 0x20 | 0xffffffff),0);
      uVar16 = uVar16 + 1;
      puVar15 = puVar15 + 2;
    } while (uVar16 < (ulong)((long)(graph->super_directed_graph_t).edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(graph->super_directed_graph_t).edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1) >> 1);
  }
  sVar8 = local_98;
  local_50 = complex;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)&local_90,local_98,(allocator_type *)&local_d0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&local_d0,sVar8,(allocator_type *)&local_b8);
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (reorder_edges_t *)0x0;
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (reorder_edges_t *)0x0;
  if (sVar8 != 0) {
    lVar17 = 0;
    sVar8 = local_98;
    do {
      local_48.new_edges =
           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
           ((long)&(((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)local_90._0_8_
                    )->_M_impl).super__Vector_impl_data._M_start + lVar17);
      local_48.new_filtration =
           (vector<float,_std::allocator<float>_> *)
           (CONCAT44(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     CONCAT22(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._2_2_,
                              (ushort)local_d0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start)) + lVar17);
      local_48.reorder_filtration = bVar9;
      if (local_b8.
          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
        ::_M_realloc_insert<directed_flag_complex_in_memory_computer::reorder_edges_t>
                  (&local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        *(ulong *)&(local_b8.
                    super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->reorder_filtration =
             CONCAT71(local_48._17_7_,bVar9);
        (local_b8.
         super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_edges = local_48.new_edges;
        (local_b8.
         super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_filtration = local_48.new_filtration;
        local_b8.
        super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar17 = lVar17 + 0x18;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
  }
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
  for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>(local_50,&local_b8,1,-1);
  if (local_98 != 0) {
    puVar15 = (graph->super_directed_graph_t).edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar17 = CONCAT44(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      CONCAT22(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start._2_2_,
                               (ushort)local_d0.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
    sVar10 = 0;
    lVar11 = 0;
    lVar12 = 0;
    do {
      puVar2 = (((pointer)(local_90._0_8_ + sVar10 * 0x18))->
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar13 = *(unsigned_short **)(local_90._0_8_ + sVar10 * 0x18); puVar13 != puVar2;
          puVar13 = puVar13 + 1) {
        puVar15[lVar11] = *puVar13;
        lVar11 = lVar11 + 1;
      }
      if (bVar9 != false) {
        pfVar3 = *(float **)(lVar17 + 8 + sVar10 * 0x18);
        for (pfVar14 = *(float **)(lVar17 + sVar10 * 0x18); pfVar14 != pfVar3; pfVar14 = pfVar14 + 1
            ) {
          pfVar1[lVar12] = *pfVar14;
          lVar12 = lVar12 + 1;
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_98);
  }
  if (local_b8.
      super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&local_d0);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)&local_90);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		compute_filtration_t compute_filtration(filtration_algorithm, graph, complex);
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration = compute_filtration.filtration();
	}

	// Reorder the edge filtration
	if (!computed_edge_filtration && filtration_algorithm != nullptr) {
		vertex_index_t* edge = &graph.edges[0];
		value_t* filtration = &graph.edge_filtration[0];
		for (size_t index = 0; index < graph.edge_number(); ++index, edge += 2, ++filtration) {
			complex.set_data(1, edge, std::make_pair(-1, *filtration));
		}
	}

	// Now reorder the edges
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);
	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++)
		reorder_filtration.push_back(reorder_edges_t(new_edges[i], new_filtrations[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr));
	complex.for_each_cell(reorder_filtration, 1);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
		if (!computed_edge_filtration && filtration_algorithm != nullptr)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
	}
}